

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atcp.c
# Opt level: O3

void nn_atcp_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  nn_fsm *in_RAX;
  nn_usock *self_00;
  nn_fsm *pnVar2;
  
  if (type == -3 && src == -2) {
LAB_0012b859:
    nn_atcp_shutdown_cold_2();
    pnVar2 = in_RAX;
  }
  else {
    pnVar2 = self + 1;
    if (*(int *)&self[1].fn == 8) goto LAB_0012b88a;
    if (*(int *)&self[1].fn != 7) {
      nn_atcp_shutdown_cold_1();
      goto LAB_0012b859;
    }
  }
  iVar1 = nn_stcp_isidle((nn_stcp *)&self[8].stopped);
  if (iVar1 == 0) {
    return;
  }
  nn_usock_stop((nn_usock *)&self[1].state);
  *(undefined4 *)&pnVar2->fn = 8;
LAB_0012b88a:
  iVar1 = nn_usock_isidle((nn_usock *)&self[1].state);
  if (iVar1 == 0) {
    return;
  }
  self_00 = (nn_usock *)self[8].srcptr;
  if (self_00 != (nn_usock *)0x0) {
    if (self[8].ctx == (nn_ctx *)0x0) {
      nn_atcp_shutdown_cold_3();
      pnVar2 = (nn_fsm *)(ulong)(uint)self_00->state;
      if (self_00->state != 1) {
        nn_atcp_term_cold_1();
        nn_fsm_isidle(pnVar2);
        return;
      }
      nn_list_item_term((nn_list_item *)&self_00[2].event_error.type);
      nn_fsm_event_term((nn_fsm_event *)&self_00[2].event_received.type);
      nn_fsm_event_term((nn_fsm_event *)&self_00[2].event_sent.type);
      nn_stcp_term((nn_stcp *)&self_00[1].wfd.hndl);
      nn_usock_term((nn_usock *)&self_00->s);
      nn_fsm_term(&self_00->fsm);
      return;
    }
    nn_usock_swap_owner(self_00,(nn_fsm_owner *)&self[8].owner);
    self[8].srcptr = (void *)0x0;
    *(undefined4 *)&self[8].owner = 0xffffffff;
    self[8].ctx = (nn_ctx *)0x0;
  }
  *(undefined4 *)&pnVar2->fn = 1;
  nn_fsm_stopped(self,0x85b9);
  return;
}

Assistant:

static void nn_atcp_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_atcp *atcp;

    atcp = nn_cont (self, struct nn_atcp, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        if (!nn_stcp_isidle (&atcp->stcp)) {
            nn_epbase_stat_increment (atcp->epbase,
                NN_STAT_DROPPED_CONNECTIONS, 1);
            nn_stcp_stop (&atcp->stcp);
        }
        atcp->state = NN_ATCP_STATE_STOPPING_STCP_FINAL;
    }
    if (nn_slow (atcp->state == NN_ATCP_STATE_STOPPING_STCP_FINAL)) {
        if (!nn_stcp_isidle (&atcp->stcp))
            return;
        nn_usock_stop (&atcp->usock);
        atcp->state = NN_ATCP_STATE_STOPPING;
    }
    if (nn_slow (atcp->state == NN_ATCP_STATE_STOPPING)) {
        if (!nn_usock_isidle (&atcp->usock))
            return;
       if (atcp->listener) {
            nn_assert (atcp->listener_owner.fsm);
            nn_usock_swap_owner (atcp->listener, &atcp->listener_owner);
            atcp->listener = NULL;
            atcp->listener_owner.src = -1;
            atcp->listener_owner.fsm = NULL;
        }
        atcp->state = NN_ATCP_STATE_IDLE;
        nn_fsm_stopped (&atcp->fsm, NN_ATCP_STOPPED);
        return;
    }

    nn_fsm_bad_action(atcp->state, src, type);
}